

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

SquareMatrix<3> * pbrt::SquareMatrix<3>::Zero(void)

{
  SquareMatrix<3> *in_RDI;
  
  SquareMatrix(in_RDI);
  *(Float *)((long)(in_RDI->m + 0) + 0) = 0.0;
  *(Float *)((long)(in_RDI->m + 0) + 4) = 0.0;
  *(undefined8 *)(in_RDI->m[0] + 2) = 0;
  *(Float *)((long)(in_RDI->m + 1) + 4) = 0.0;
  *(Float *)((long)(in_RDI->m + 1) + 8) = 0.0;
  *(Float *)((long)(in_RDI->m + 2) + 0) = 0.0;
  *(Float *)((long)(in_RDI->m + 2) + 4) = 0.0;
  in_RDI->m[2][2] = 0.0;
  return in_RDI;
}

Assistant:

Zero() {
        SquareMatrix m;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                m.m[i][j] = 0;
        return m;
    }